

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void bestAutomaticIndex(WhereBestIdx *p)

{
  int iVar1;
  Parse *pPVar2;
  WhereClause *pWVar3;
  SrcList_item *pSrc_00;
  WhereTerm *pWVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  Table *pTable;
  WhereTerm *pWCEnd;
  WhereTerm *pTerm;
  double costTempIdx;
  double logN;
  double nTableRow;
  SrcList_item *pSrc;
  WhereClause *pWC;
  Parse *pParse;
  WhereBestIdx *p_local;
  
  pPVar2 = p->pParse;
  pWVar3 = p->pWC;
  pSrc_00 = p->pSrc;
  if ((((1.0 < pPVar2->nQueryLoop) && ((pPVar2->db->flags & 0x80000U) != 0)) &&
      ((((p->cost).plan.wsFlags & 0x100f3000) == 0 || (((p->cost).plan.wsFlags & 0x80000000) != 0)))
      ) && (((((byte)pSrc_00->field_0x39 >> 2 & 1) == 0 && ((pSrc_00->field_0x39 & 1) == 0)) &&
            (((byte)pSrc_00->field_0x39 >> 1 & 1) == 0)))) {
    dVar6 = (double)pSrc_00->pTab->nRowEst;
    dVar7 = estLog(dVar6);
    dVar6 = dVar7 * 2.0 * (dVar6 / pPVar2->nQueryLoop + 1.0);
    if (dVar6 < (p->cost).rCost) {
      pWVar4 = pWVar3->a;
      iVar1 = pWVar3->nTerm;
      for (pWCEnd = pWVar3->a; pWCEnd < pWVar4 + iVar1; pWCEnd = pWCEnd + 1) {
        iVar5 = termCanDriveIndex(pWCEnd,pSrc_00,p->notReady);
        if (iVar5 != 0) {
          (p->cost).rCost = dVar6;
          (p->cost).plan.nRow = dVar7 + 1.0;
          (p->cost).plan.wsFlags = 0x20000000;
          (p->cost).used = pWCEnd->prereqRight;
          return;
        }
      }
    }
  }
  return;
}

Assistant:

static void bestAutomaticIndex(WhereBestIdx *p){
  Parse *pParse = p->pParse;            /* The parsing context */
  WhereClause *pWC = p->pWC;            /* The WHERE clause */
  struct SrcList_item *pSrc = p->pSrc;  /* The FROM clause term to search */
  double nTableRow;                     /* Rows in the input table */
  double logN;                          /* log(nTableRow) */
  double costTempIdx;         /* per-query cost of the transient index */
  WhereTerm *pTerm;           /* A single term of the WHERE clause */
  WhereTerm *pWCEnd;          /* End of pWC->a[] */
  Table *pTable;              /* Table tht might be indexed */

  if( pParse->nQueryLoop<=(double)1 ){
    /* There is no point in building an automatic index for a single scan */
    return;
  }
  if( (pParse->db->flags & SQLITE_AutoIndex)==0 ){
    /* Automatic indices are disabled at run-time */
    return;
  }
  if( (p->cost.plan.wsFlags & WHERE_NOT_FULLSCAN)!=0
   && (p->cost.plan.wsFlags & WHERE_COVER_SCAN)==0
  ){
    /* We already have some kind of index in use for this query. */
    return;
  }
  if( pSrc->viaCoroutine ){
    /* Cannot index a co-routine */
    return;
  }
  if( pSrc->notIndexed ){
    /* The NOT INDEXED clause appears in the SQL. */
    return;
  }
  if( pSrc->isCorrelated ){
    /* The source is a correlated sub-query. No point in indexing it. */
    return;
  }

  assert( pParse->nQueryLoop >= (double)1 );
  pTable = pSrc->pTab;
  nTableRow = pTable->nRowEst;
  logN = estLog(nTableRow);
  costTempIdx = 2*logN*(nTableRow/pParse->nQueryLoop + 1);
  if( costTempIdx>=p->cost.rCost ){
    /* The cost of creating the transient table would be greater than
    ** doing the full table scan */
    return;
  }

  /* Search for any equality comparison term */
  pWCEnd = &pWC->a[pWC->nTerm];
  for(pTerm=pWC->a; pTerm<pWCEnd; pTerm++){
    if( termCanDriveIndex(pTerm, pSrc, p->notReady) ){
      WHERETRACE(("auto-index reduces cost from %.1f to %.1f\n",
                    p->cost.rCost, costTempIdx));
      p->cost.rCost = costTempIdx;
      p->cost.plan.nRow = logN + 1;
      p->cost.plan.wsFlags = WHERE_TEMP_INDEX;
      p->cost.used = pTerm->prereqRight;
      break;
    }
  }
}